

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

UINT16 TPMS_ATTEST_Marshal(TPMS_ATTEST *source,BYTE **buffer,INT32 *size)

{
  UINT16 UVar1;
  UINT16 UVar2;
  UINT16 UVar3;
  
  UINT32_Marshal(&source->magic,buffer,size);
  UINT16_Marshal(&source->type,buffer,size);
  UVar1 = TPM2B_NAME_Marshal(&source->qualifiedSigner,buffer,size);
  UVar2 = TPM2B_DATA_Marshal(&source->extraData,buffer,size);
  TPMS_CLOCK_INFO_Marshal(&source->clockInfo,buffer,size);
  UINT64_Marshal(&source->firmwareVersion,buffer,size);
  UVar3 = TPMU_ATTEST_Marshal(&source->attested,buffer,size,(uint)source->type);
  return UVar3 + UVar2 + UVar1 + 0x1f;
}

Assistant:

UINT16
TPMS_ATTEST_Marshal(TPMS_ATTEST *source, BYTE **buffer, INT32 *size)
{
    UINT16    result = 0;
    result = (UINT16)(result + TPM_GENERATED_Marshal((TPM_GENERATED *)&(source->magic), buffer, size));
    result = (UINT16)(result + TPMI_ST_ATTEST_Marshal((TPMI_ST_ATTEST *)&(source->type), buffer, size));
    result = (UINT16)(result + TPM2B_NAME_Marshal((TPM2B_NAME *)&(source->qualifiedSigner), buffer, size));
    result = (UINT16)(result + TPM2B_DATA_Marshal((TPM2B_DATA *)&(source->extraData), buffer, size));
    result = (UINT16)(result + TPMS_CLOCK_INFO_Marshal((TPMS_CLOCK_INFO *)&(source->clockInfo), buffer, size));
    result = (UINT16)(result + UINT64_Marshal((UINT64 *)&(source->firmwareVersion), buffer, size));
    result = (UINT16)(result + TPMU_ATTEST_Marshal((TPMU_ATTEST *)&(source->attested), buffer, size, (UINT32)source->type));
    return result;
}